

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O1

bool __thiscall
sptk::SpectrumToSpectrum::Run
          (SpectrumToSpectrum *this,vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output)

{
  pointer __src;
  char cVar1;
  int iVar2;
  size_t __n;
  size_type __new_size;
  pointer ppOVar3;
  bool bVar4;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if ((output != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (size_type)(this->fft_length_ / 2 + 1), bVar4 = false,
       (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
      }
      if (input != output) {
        __src = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
        __n = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
      }
      ppOVar3 = (this->operations_).
                super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = ppOVar3 ==
              (this->operations_).
              super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar4) {
        iVar2 = (*(*ppOVar3)->_vptr_OperationInterface[2])(*ppOVar3,output);
        cVar1 = (char)iVar2;
        while (cVar1 != '\0') {
          ppOVar3 = ppOVar3 + 1;
          bVar4 = ppOVar3 ==
                  (this->operations_).
                  super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar4) {
            return bVar4;
          }
          iVar2 = (*(*ppOVar3)->_vptr_OperationInterface[2])(*ppOVar3,output);
          cVar1 = (char)iVar2;
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SpectrumToSpectrum::Run(const std::vector<double>& input,
                             std::vector<double>* output) const {
  // Check inputs.
  const int length(fft_length_ / 2 + 1);
  if (!is_valid_ || input.size() != static_cast<std::size_t>(length) ||
      NULL == output) {
    return false;
  }

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(length)) {
    output->resize(length);
  }

  if (&input != output) {
    std::copy(input.begin(), input.end(), output->begin());
  }

  for (std::vector<SpectrumToSpectrum::OperationInterface*>::const_iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    if (!(*itr)->Run(output)) {
      return false;
    }
  }

  return true;
}